

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
          (option *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator pvVar4;
  ref_type pbVar5;
  ref_type pbVar6;
  res_type pbVar7;
  size_t sVar8;
  ref_type pbVar9;
  ref_type pbVar10;
  cstring *value_separator;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *params;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *params_00;
  undefined1 local_201 [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  param_cla_ids *local_1c0;
  string *local_1b8;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *local_1b0;
  iterator local_1a8;
  ref_type local_1a0;
  undefined1 local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  type local_158;
  basic_cstring<const_char> local_108;
  value_type local_f8;
  undefined8 local_f7;
  undefined4 local_ef;
  undefined2 local_eb;
  char local_e9;
  cstring local_e8;
  undefined1 local_d0 [32];
  cstring local_b0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_a0;
  type local_80;
  
  pbVar10 = (ref_type)name->m_begin;
  pvVar4 = name->m_end;
  local_d0._0_8_ = local_201;
  local_201[0] = 1;
  local_d0[8] = false;
  local_1b0 = m;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            (&local_80,(nfp *)m,
             (named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              *)local_d0,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
              *)m);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&local_158,(nfp *)&local_80,params,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
              *)m);
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0df0;
  local_1b8 = &(this->super_basic_param).p_name;
  (this->super_basic_param).p_name._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_name.field_2;
  local_1a8 = pvVar4;
  local_1a0 = pbVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pbVar10,pvVar4);
  pcVar3 = local_198 + 0x10;
  local_198._8_8_ = 0;
  local_198[0x10] = '\0';
  local_198._0_8_ = pcVar3;
  pbVar5 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[]((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
                         *)&local_158);
  local_1e8._M_dataplus._M_p = pbVar5->m_begin;
  local_1e8._M_string_length = (size_type)pbVar5->m_end;
  unit_test::assign_op<char,char_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (basic_cstring<const_char> *)&local_1e8,0);
  local_201._9_8_ = &(this->super_basic_param).p_description;
  paVar1 = &(this->super_basic_param).p_description.field_2;
  (this->super_basic_param).p_description._M_dataplus._M_p = (pointer)paVar1;
  if ((pointer)local_198._0_8_ == pcVar3) {
    paVar1->_M_allocated_capacity = CONCAT71(local_198._17_7_,local_198[0x10]);
    *(undefined8 *)((long)&(this->super_basic_param).p_description.field_2 + 8) = local_198._24_8_;
  }
  else {
    (((string *)local_201._9_8_)->_M_dataplus)._M_p = (pointer)local_198._0_8_;
    paVar1->_M_allocated_capacity = CONCAT71(local_198._17_7_,local_198[0x10]);
  }
  (this->super_basic_param).p_description._M_string_length = local_198._8_8_;
  local_198._8_8_ = 0;
  local_198[0x10] = '\0';
  local_1f0 = &local_1e8;
  local_198._0_8_ = pcVar3;
  std::__cxx11::string::~string((string *)local_198);
  paVar2 = &local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar2;
  pbVar6 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[](&local_158.
                         super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                         .m_param);
  local_178._M_dataplus._M_p = pbVar6->m_begin;
  local_178._M_string_length = (size_type)pbVar6->m_end;
  unit_test::assign_op<char,char_const>
            (&local_1e8,(basic_cstring<const_char> *)(local_198 + 0x20),0);
  local_1f0 = &(this->super_basic_param).p_help;
  paVar1 = &(this->super_basic_param).p_help.field_2;
  (this->super_basic_param).p_help._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_basic_param).p_help.field_2 + 8) = local_1e8.field_2._8_8_;
  }
  else {
    (local_1f0->_M_dataplus)._M_p = local_1e8._M_dataplus._M_p;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
  }
  (this->super_basic_param).p_help._M_string_length = local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::~string((string *)&local_1e8);
  paVar2 = &local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)paVar2;
  pbVar7 = nfp::
           named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
           ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                         *)&local_158);
  local_108.m_begin = pbVar7->m_begin;
  local_108.m_end = pbVar7->m_end;
  unit_test::assign_op<char,char_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 0x20)
             ,&local_108,0);
  local_201._1_8_ = &(this->super_basic_param).p_env_var;
  paVar1 = &(this->super_basic_param).p_env_var.field_2;
  (this->super_basic_param).p_env_var._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_basic_param).p_env_var.field_2 + 8) =
         local_178.field_2._8_8_;
  }
  else {
    (((string *)local_201._1_8_)->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0]);
  }
  (this->super_basic_param).p_env_var._M_string_length = local_178._M_string_length;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::~string((string *)(local_198 + 0x20));
  local_108.m_begin = &local_f8;
  (this->super_basic_param).p_value_hint._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_value_hint.field_2;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 1) = local_f7;
  *(undefined4 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 9) = local_ef;
  *(undefined2 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 0xd) = local_eb;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0xf] = local_e9;
  (this->super_basic_param).p_value_hint._M_string_length = 0;
  local_108.m_end = (iterator)0x0;
  local_f8 = '\0';
  std::__cxx11::string::~string((string *)&local_108);
  (this->super_basic_param).p_optional = true;
  (this->super_basic_param).p_repeatable = false;
  (this->super_basic_param).p_has_optional_value.super_class_property<bool>.value =
       (bool)(local_158.m_param.m_erased ^ 1);
  (this->super_basic_param).p_has_default_value.super_class_property<bool>.value =
       (bool)(local_158.
              super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              .
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
              .m_param.m_erased ^ 1);
  local_a0.super_function_base.vtable = (vtable_base *)0x0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::function1
            (&(this->super_basic_param).p_callback.
              super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,&local_a0);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_a0);
  local_1c0 = &(this->super_basic_param).m_cla_ids;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_begin = (iterator)help_prefix._0_8_;
  local_e8.m_end = (iterator)help_prefix._8_8_;
  local_b0.m_begin = local_1a0;
  local_b0.m_end = local_1a8;
  value_separator = (cstring *)(local_d0 + 0x10);
  local_d0._16_8_ = ":";
  sVar8 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(":");
  local_d0._24_8_ = "MESSAGE:" + sVar8 + 7;
  basic_param::add_cla_id(&this->super_basic_param,&local_e8,&local_b0,value_separator);
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0d70;
  local_1e8._M_dataplus._M_p._0_1_ = 1;
  local_198._0_8_ = &local_1e8;
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            (&local_80,(nfp *)local_1b0,
             (named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              *)local_198,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
              *)value_separator);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&local_158,(nfp *)&local_80,params_00,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
              *)value_separator);
  pbVar9 = nfp::
           named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
           ::operator[](&local_158.m_param);
  (this->m_arg_factory).m_optional_value = *pbVar9;
  pbVar10 = nfp::
            named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
            ::operator[](&local_158.
                          super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                          .
                          super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                          .m_param);
  (this->m_arg_factory).m_default_value = *pbVar10;
  return;
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }